

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
          (Persistence_landscape_on_grid *this,char *filename,double grid_min_,double grid_max_,
          size_t number_of_points_,uint number_of_levels_of_landscape,uint16_t dimension)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  allocator<char> local_d9;
  string local_d8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_b8;
  allocator<char> local_89;
  string local_88;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_68;
  undefined1 local_50 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> p;
  uint16_t dimension_local;
  uint number_of_levels_of_landscape_local;
  size_t number_of_points__local;
  double grid_max__local;
  double grid_min__local;
  char *filename_local;
  Persistence_landscape_on_grid *this_local;
  
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ = dimension;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = number_of_levels_of_landscape;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->values_of_landscapes);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_50);
  uVar1 = p.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  if (uVar1 == uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,filename,&local_89);
    read_persistence_intervals_in_one_dimension_from_file(&local_68,&local_88,-1,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_50,&local_68);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,filename,&local_d9);
    read_persistence_intervals_in_one_dimension_from_file
              (&local_b8,&local_d8,
               (uint)p.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_50,&local_b8);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  set_up_values_of_landscapes
            (this,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_50,grid_min_,grid_max_,number_of_points_,
             p.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_50);
  return;
}

Assistant:

Persistence_landscape_on_grid::Persistence_landscape_on_grid(const char* filename, double grid_min_, double grid_max_,
                                                             size_t number_of_points_,
                                                             unsigned number_of_levels_of_landscape,
                                                             uint16_t dimension) {
  std::vector<std::pair<double, double> > p;
  if (dimension == std::numeric_limits<uint16_t>::max()) {
    p = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    p = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  this->set_up_values_of_landscapes(p, grid_min_, grid_max_, number_of_points_, number_of_levels_of_landscape);
}